

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::EqualTest<short,unsigned_int>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd5;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd6;
  
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                           CONCAT15(in_stack_ffffffffffffffd5,
                                    CONCAT14(in_stack_ffffffffffffffd4,
                                             in_stack_ffffffffffffffd0.m_int))),
               (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = ::operator==(in_stack_ffffffffffffffd0.m_int,in_stack_ffffffffffffffd6);
  uVar2 = false;
  if (bVar1) {
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                             CONCAT15(in_stack_ffffffffffffffd5,
                                      CONCAT14(in_stack_ffffffffffffffd4,
                                               in_stack_ffffffffffffffd0.m_int))),
                 (int *)(ulong)in_stack_ffffffffffffffc8);
    bVar1 = ::operator==(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0.m_int);
    uVar2 = false;
    if (bVar1) {
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                               CONCAT15(in_stack_ffffffffffffffd5,
                                        CONCAT14(in_stack_ffffffffffffffd4,
                                                 in_stack_ffffffffffffffd0.m_int))),
                   (int *)(ulong)in_stack_ffffffffffffffc8);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                                 CONCAT15(in_stack_ffffffffffffffd5,
                                          CONCAT14(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0.m_int))),
                     (int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
      bVar1 = ::operator==(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0);
      uVar2 = false;
      if (bVar1) {
        SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
        SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT26(in_stack_ffffffffffffffd6.m_int,
                                 CONCAT15(in_stack_ffffffffffffffd5,
                                          CONCAT14(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0.m_int))),
                     (int *)(ulong)in_stack_ffffffffffffffc8);
        bVar1 = ::operator==((bool)in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd6);
        uVar2 = false;
        if (bVar1) {
          SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
          SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)((ulong)CONCAT22(in_stack_ffffffffffffffd6.m_int,
                                           CONCAT11(in_stack_ffffffffffffffd5,
                                                    in_stack_ffffffffffffffd4)) << 0x20),
                       (int *)(ulong)in_stack_ffffffffffffffc8);
          uVar2 = ::operator==((bool)in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd6);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}